

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O1

void uv::AfterRecv(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  void *pvVar1;
  long lVar2;
  FILE *__stream;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ILog4zManager *pIVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  long *in_FS_OFFSET;
  int local_74;
  string local_70;
  string local_50;
  
  __stream = _stdout;
  pvVar1 = handle->data;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("theclass",
                  "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/tcpserver.cpp"
                  ,0x246,"void uv::AfterRecv(uv_stream_t *, ssize_t, const uv_buf_t *)");
  }
  iVar6 = (int)nread;
  if (-1 < nread) {
    if (nread == 0) {
      return;
    }
    PacketSync::recvdata(*(PacketSync **)((long)pvVar1 + 0xf8),(uchar *)buf->base,iVar6);
    return;
  }
  if (nread == -0x68) {
    fprintf(_stdout,"client(%d)conn reset\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
    lVar2 = *in_FS_OFFSET;
    puVar9 = (undefined8 *)(lVar2 + -0x800);
    *puVar9 = 0x28746e65696c63;
    pcVar11 = (char *)(lVar2 + -0x7f9);
    uVar4 = snprintf(pcVar11,0x7f9,"%d",(ulong)*(uint *)((long)pvVar1 + 0x110));
    uVar3 = 0;
    if ((int)uVar4 < 0) {
LAB_0011b160:
      uVar4 = uVar3;
      *pcVar11 = '\0';
    }
    else if (0x7f8 < (int)uVar4) {
      pcVar11 = (char *)(lVar2 + -1);
      uVar3 = 0x7f9;
      goto LAB_0011b160;
    }
    uVar12 = (ulong)(uVar4 + 7);
    if (uVar4 < 0x7f9) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (uVar4 + 7);
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s",")conn reset");
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b1ae:
        *pcVar11 = '\0';
      }
      else {
        iVar6 = iVar5;
        if (iVar10 <= iVar5) {
          pcVar11 = (char *)(lVar2 + -1);
          iVar6 = iVar10;
          goto LAB_0011b1ae;
        }
      }
      uVar12 = uVar12 + (long)iVar6;
    }
    if ((long)uVar12 < 0x800) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (int)uVar12;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ( ");
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b1ff:
        *pcVar11 = '\0';
      }
      else {
        iVar6 = iVar5;
        if (iVar10 <= iVar5) {
          pcVar11 = (char *)(lVar2 + -1);
          iVar6 = iVar10;
          goto LAB_0011b1ff;
        }
      }
      uVar12 = uVar12 + (long)iVar6;
    }
    if ((long)uVar12 < 0x800) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (int)uVar12;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ");
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b250:
        *pcVar11 = '\0';
      }
      else {
        iVar6 = iVar5;
        if (iVar10 <= iVar5) {
          pcVar11 = (char *)(lVar2 + -1);
          iVar6 = iVar10;
          goto LAB_0011b250;
        }
      }
      uVar12 = uVar12 + (long)iVar6;
    }
    if ((long)uVar12 < 0x800) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (int)uVar12;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ) : ");
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b2a1:
        *pcVar11 = '\0';
      }
      else {
        iVar6 = iVar5;
        if (iVar10 <= iVar5) {
          pcVar11 = (char *)(lVar2 + -1);
          iVar6 = iVar10;
          goto LAB_0011b2a1;
        }
      }
      uVar12 = uVar12 + (long)iVar6;
    }
    if (0x7ff < (long)uVar12) goto LAB_0011b59e;
    pcVar11 = (char *)((long)puVar9 + uVar12);
    iVar6 = (int)uVar12;
    uVar8 = 0x24d;
LAB_0011b2d8:
    iVar5 = snprintf(pcVar11,(long)(0x800 - iVar6),"%d",uVar8);
    if (-1 < iVar5) {
      if (iVar5 < 0x800 - iVar6) goto LAB_0011b59e;
LAB_0011b590:
      pcVar11 = (char *)((long)puVar9 + 0x7ff);
    }
  }
  else {
    if (nread == -0xfff) {
      fprintf(_stdout,"client(%d)eof\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
      lVar2 = *in_FS_OFFSET;
      puVar9 = (undefined8 *)(lVar2 + -0x800);
      *puVar9 = 0x28746e65696c63;
      pcVar11 = (char *)(lVar2 + -0x7f9);
      uVar4 = snprintf(pcVar11,0x7f9,"%d",(ulong)*(uint *)((long)pvVar1 + 0x110));
      uVar3 = 0;
      if ((int)uVar4 < 0) {
LAB_0011af6f:
        uVar4 = uVar3;
        *pcVar11 = '\0';
      }
      else if (0x7f8 < (int)uVar4) {
        pcVar11 = (char *)(lVar2 + -1);
        uVar3 = 0x7f9;
        goto LAB_0011af6f;
      }
      uVar12 = (ulong)(uVar4 + 7);
      if (uVar4 < 0x7f9) {
        pcVar11 = (char *)((long)puVar9 + uVar12);
        iVar10 = 0x800 - (uVar4 + 7);
        iVar5 = snprintf(pcVar11,(long)iVar10,"%s",")eof");
        iVar6 = 0;
        if (iVar5 < 0) {
LAB_0011afbd:
          *pcVar11 = '\0';
        }
        else {
          iVar6 = iVar5;
          if (iVar10 <= iVar5) {
            pcVar11 = (char *)(lVar2 + -1);
            iVar6 = iVar10;
            goto LAB_0011afbd;
          }
        }
        uVar12 = uVar12 + (long)iVar6;
      }
      if ((long)uVar12 < 0x800) {
        pcVar11 = (char *)((long)puVar9 + uVar12);
        iVar10 = 0x800 - (int)uVar12;
        iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ( ");
        iVar6 = 0;
        if (iVar5 < 0) {
LAB_0011b00e:
          *pcVar11 = '\0';
        }
        else {
          iVar6 = iVar5;
          if (iVar10 <= iVar5) {
            pcVar11 = (char *)(lVar2 + -1);
            iVar6 = iVar10;
            goto LAB_0011b00e;
          }
        }
        uVar12 = uVar12 + (long)iVar6;
      }
      if ((long)uVar12 < 0x800) {
        pcVar11 = (char *)((long)puVar9 + uVar12);
        iVar10 = 0x800 - (int)uVar12;
        iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ");
        iVar6 = 0;
        if (iVar5 < 0) {
LAB_0011b05f:
          *pcVar11 = '\0';
        }
        else {
          iVar6 = iVar5;
          if (iVar10 <= iVar5) {
            pcVar11 = (char *)(lVar2 + -1);
            iVar6 = iVar10;
            goto LAB_0011b05f;
          }
        }
        uVar12 = uVar12 + (long)iVar6;
      }
      if ((long)uVar12 < 0x800) {
        pcVar11 = (char *)((long)puVar9 + uVar12);
        iVar10 = 0x800 - (int)uVar12;
        iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ) : ");
        iVar6 = 0;
        if (iVar5 < 0) {
LAB_0011b0b0:
          *pcVar11 = '\0';
        }
        else {
          iVar6 = iVar5;
          if (iVar10 <= iVar5) {
            pcVar11 = (char *)(lVar2 + -1);
            iVar6 = iVar10;
            goto LAB_0011b0b0;
          }
        }
        uVar12 = uVar12 + (long)iVar6;
      }
      if (0x7ff < (long)uVar12) goto LAB_0011b59e;
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar6 = (int)uVar12;
      uVar8 = 0x24a;
      goto LAB_0011b2d8;
    }
    GetUVError_abi_cxx11_(&local_50,iVar6);
    fprintf(__stream,"%s\n",local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar2 = *in_FS_OFFSET;
    puVar9 = (undefined8 *)(lVar2 + -0x800);
    *puVar9 = 0x28746e65696c63;
    pcVar11 = (char *)(lVar2 + -0x7f9);
    uVar4 = snprintf(pcVar11,0x7f9,"%d",(ulong)*(uint *)((long)pvVar1 + 0x110));
    uVar3 = 0;
    if ((int)uVar4 < 0) {
LAB_0011b38e:
      uVar4 = uVar3;
      *pcVar11 = '\0';
    }
    else if (0x7f8 < (int)uVar4) {
      pcVar11 = (char *)(lVar2 + -1);
      uVar3 = 0x7f9;
      goto LAB_0011b38e;
    }
    uVar12 = (ulong)(uVar4 + 7);
    if (uVar4 < 0x7f9) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (uVar4 + 7);
      local_74 = 0;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s",anon_var_dwarf_df75);
      if (iVar5 < 0) {
LAB_0011b3e1:
        *pcVar11 = '\0';
      }
      else {
        local_74 = iVar5;
        if (iVar10 <= iVar5) {
          pcVar11 = (char *)(lVar2 + -1);
          local_74 = iVar10;
          goto LAB_0011b3e1;
        }
      }
      uVar12 = uVar12 + (long)local_74;
    }
    GetUVError_abi_cxx11_(&local_70,iVar6);
    if ((long)uVar12 < 0x800) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (int)uVar12;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s",local_70._M_dataplus._M_p);
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b43f:
        iVar5 = iVar6;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar5) {
        pcVar11 = (char *)(lVar2 + -1);
        iVar6 = iVar10;
        goto LAB_0011b43f;
      }
      uVar12 = uVar12 + (long)iVar5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((long)uVar12 < 0x800) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (int)uVar12;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ( ");
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b4ab:
        iVar5 = iVar6;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar5) {
        pcVar11 = (char *)(lVar2 + -1);
        iVar6 = iVar10;
        goto LAB_0011b4ab;
      }
      uVar12 = uVar12 + (long)iVar5;
    }
    if ((long)uVar12 < 0x800) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (int)uVar12;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ");
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b4fc:
        iVar5 = iVar6;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar5) {
        pcVar11 = (char *)(lVar2 + -1);
        iVar6 = iVar10;
        goto LAB_0011b4fc;
      }
      uVar12 = uVar12 + (long)iVar5;
    }
    if ((long)uVar12 < 0x800) {
      pcVar11 = (char *)((long)puVar9 + uVar12);
      iVar10 = 0x800 - (int)uVar12;
      iVar5 = snprintf(pcVar11,(long)iVar10,"%s"," ) : ");
      iVar6 = 0;
      if (iVar5 < 0) {
LAB_0011b54d:
        iVar5 = iVar6;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar5) {
        pcVar11 = (char *)(lVar2 + -1);
        iVar6 = iVar10;
        goto LAB_0011b54d;
      }
      uVar12 = uVar12 + (long)iVar5;
    }
    if (0x7ff < (long)uVar12) goto LAB_0011b59e;
    pcVar11 = (char *)((long)puVar9 + uVar12);
    iVar5 = 0x800 - (int)uVar12;
    iVar6 = snprintf(pcVar11,(long)iVar5,"%d",0x250);
    if (-1 < iVar6) {
      if (iVar6 < iVar5) goto LAB_0011b59e;
      goto LAB_0011b590;
    }
  }
  *pcVar11 = '\0';
LAB_0011b59e:
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,2,puVar9);
  AcceptClient::Close(*(AcceptClient **)((long)pvVar1 + 0x120));
  return;
}

Assistant:

void AfterRecv(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->data;
    assert(theclass);
    if (nread < 0) {/* Error or EOF */
        if (nread == UV_EOF) {
            fprintf(stdout, "client(%d)eof\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")eof");
        } else if (nread == UV_ECONNRESET) {
            fprintf(stdout, "client(%d)conn reset\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")conn reset");
        } else {
            fprintf(stdout, "%s\n", GetUVError(nread).c_str());
            LOGW("client(" << theclass->clientid << ")：" << GetUVError(nread));
        }
        AcceptClient* acceptclient = (AcceptClient*)theclass->parent_acceptclient;
        acceptclient->Close();
        return;
    } else if (0 == nread)  {/* Everything OK, but nothing read. */

    } else {
        theclass->packet_->recvdata((const unsigned char*)buf->base, nread);
    }
}